

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-junk.c
# Opt level: O3

_Bool borg_drop_junk(void)

{
  byte bVar1;
  char cVar2;
  borg_item_conflict *pbVar3;
  _Bool _Var4;
  bool bVar5;
  wchar_t wVar6;
  int iVar7;
  int32_t iVar8;
  char *pcVar9;
  byte bVar10;
  byte bVar11;
  wchar_t *pwVar12;
  _Bool *p_Var13;
  long lVar14;
  byte bVar15;
  ulong uVar16;
  int local_4c;
  int local_48;
  int32_t local_44;
  
  local_44 = borg.power;
  if (((borg_do_crush_junk) && (borg.goal.recalling == L'\0')) &&
     (wVar6 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false), wVar6 <= borg.trait[0x1b] / 10)) {
    if (z_info->pack_size != 0) {
      local_48 = -1;
      lVar14 = 0;
      uVar16 = 0;
      bVar5 = false;
      do {
        pbVar3 = borg_items;
        if (((borg_items->curses[lVar14 + -0x26] != false) &&
            (weapon_swap == 0 || uVar16 != weapon_swap - 1)) &&
           ((armour_swap == 0 || uVar16 != armour_swap - 1 &&
            (_Var4 = obj_kind_can_browse(k_info + *(uint *)(borg_items->curses + lVar14 + -0x32)),
            !_Var4)))) {
          bVar15 = pbVar3->curses[lVar14 + -0x2a];
          if (bVar15 == 10) {
            if (pbVar3->curses[lVar14 + -0x2e] == true) {
LAB_0022f9b6:
              p_Var13 = pbVar3->curses + lVar14 + -6;
              local_4c = *(int *)p_Var13;
              goto LAB_0022fa50;
            }
            goto LAB_0022fa67;
          }
          if (bVar15 == 0x19) {
            if (pbVar3->curses[lVar14 + -0x2c] != false) goto LAB_0022f9b6;
            goto LAB_0022fa67;
          }
          p_Var13 = (_Bool *)&pbVar3[uVar16].value;
          local_4c = *(int *)(pbVar3->curses + lVar14 + -6);
          if ((bVar15 & 0xfe) == 0x16) {
            if (((pbVar3->curses[lVar14 + -0x2c] != false) ||
                ((*(char **)(pbVar3->curses + lVar14 + -0x3a) != (char *)0x0 &&
                 (pcVar9 = strstr(*(char **)(pbVar3->curses + lVar14 + -0x3a),"empty"),
                 pcVar9 != (char *)0x0)))) &&
               (*(short *)(pbVar3->curses + lVar14 + -0x28) <
                (short)(ushort)pbVar3->curses[lVar14 + -0x26])) {
              local_4c = 0;
            }
          }
          else if ((_Bool)bVar15 == false) goto LAB_0022fa67;
LAB_0022fa50:
          if ((pbVar3->curses[lVar14 + -0x2e] == false) && (0 < local_4c)) goto LAB_0022fa67;
          if ((((0 < *(short *)((long)pbVar3->modifiers + lVar14)) ||
               (((0 < *(short *)((long)pbVar3->modifiers + lVar14 + 2) ||
                 (0 < *(short *)((long)pbVar3->modifiers + lVar14 + 4))) ||
                (0 < *(short *)((long)pbVar3->modifiers + lVar14 + 6))))) ||
              (0 < *(short *)((long)pbVar3->modifiers + lVar14 + 8))) && (0 < local_4c)) {
            local_4c = local_4c + 2000;
          }
          iVar7 = local_4c + 5000;
          if (local_4c < 1) {
            iVar7 = local_4c;
          }
          if (borg.trait[0x98] != (uint)bVar15) {
            iVar7 = local_4c;
          }
          if (pbVar3->curses[lVar14 + -0x2c] == true) {
            switch((uint)bVar15) {
            case 0x16:
              _Var4 = pbVar3->curses[lVar14 + -0x29];
              bVar10 = 0x16;
              if ((sv_staff_dispel_evil != (uint)_Var4) &&
                 ((sv_staff_power != (uint)_Var4 && (sv_staff_holiness != (uint)_Var4))))
              goto switchD_0022fb1b_caseD_19;
              break;
            case 0x17:
              bVar1 = pbVar3->curses[lVar14 + -0x29];
              bVar11 = 0x17;
              bVar10 = 0x17;
              if ((sv_wand_drain_life != (uint)bVar1) && (sv_wand_annihilation != (uint)bVar1)) {
                pwVar12 = &sv_wand_teleport_away;
LAB_0022fbb3:
                if ((*pwVar12 != (uint)bVar1) || (bVar10 = bVar11, borg.trait[0x19] != 0))
                goto switchD_0022fb1b_caseD_19;
              }
              break;
            case 0x18:
              bVar1 = pbVar3->curses[lVar14 + -0x29];
              bVar11 = 0x18;
              bVar10 = 0x18;
              if ((sv_rod_drain_life != (uint)bVar1) && (sv_rod_healing != (uint)bVar1)) {
                pwVar12 = &sv_rod_mapping;
                goto LAB_0022fbb3;
              }
              break;
            default:
switchD_0022fb1b_caseD_19:
              if ((ulong)pbVar3->curses[lVar14 + -0x21] != 0) {
                _Var4 = borg_ego_has_random_power(e_info + pbVar3->curses[lVar14 + -0x21]);
                bVar15 = pbVar3->curses[lVar14 + -0x2a];
                bVar10 = bVar15;
                if (_Var4) break;
              }
              if (bVar15 != 0x19) goto LAB_0022fcb6;
              if (((sv_scroll_teleport_level == (uint)pbVar3->curses[lVar14 + -0x29]) &&
                  (bVar10 = 0x19, borg.trait[0xf7] < 1000)) ||
                 (local_4c = iVar7, bVar10 = 0x19,
                 sv_scroll_protection_from_evil == (uint)pbVar3->curses[lVar14 + -0x29])) break;
              goto LAB_0022fcf1;
            case 0x1a:
              _Var4 = pbVar3->curses[lVar14 + -0x29];
              if ((((sv_potion_restore_mana != (uint)_Var4) || (bVar10 = 0x1a, borg.trait[0x1f] < 1)
                   ) && ((bVar10 = 0x1a, sv_potion_healing != (uint)_Var4 &&
                         ((wVar6 = (wchar_t)_Var4, sv_potion_star_healing != wVar6 &&
                          (sv_potion_life != wVar6)))))) && (sv_potion_speed != wVar6))
              goto switchD_0022fb1b_caseD_19;
            }
            bVar15 = bVar10;
            iVar7 = iVar7 + 5000;
          }
LAB_0022fcb6:
          local_4c = iVar7;
          if (bVar15 == 6) {
            local_4c = 0;
          }
          if (((byte)(bVar15 - 2) < 3) && (local_4c = iVar7, borg.trait[0x98] != (uint)bVar15)) {
            local_4c = 0;
          }
LAB_0022fcf1:
          if (0 < *(int *)p_Var13) {
            iVar7 = borg.trait[0x24];
            if (borg_cfg[9] == 0) {
              if ((iVar7 < 10) ||
                 ((iVar7 < 0x15 && borg_cfg[0x18] < borg.trait[0x2d]) && borg_cfg[0x18] != 0))
              goto LAB_0022fd3f;
            }
            else if (iVar7 < 0x15) {
LAB_0022fd3f:
              if (pbVar3->curses[lVar14 + -2] != true) goto LAB_0022fa67;
            }
          }
          iVar7 = borg.trait[0x69];
          if ((((((4 < iVar7) || (local_4c < 1)) && ((9 < iVar7 || (local_4c < 0x10)))) &&
               (((0xe < iVar7 || (local_4c < 0x65)) && ((0x1d < iVar7 || (local_4c < 0x1f5)))))) &&
              ((((0x27 < iVar7 || (local_4c < 0x3e9)) && ((0x3b < iVar7 || (local_4c < 0x4b1)))) &&
               (((0x4f < iVar7 || (local_4c < 0x579)) && ((0x59 < iVar7 || (local_4c < 0x641))))))))
             && (((((0x5e < iVar7 || (local_4c < 0x12c1)) && ((0x7e < iVar7 || (local_4c < 0x15e1)))
                   ) && (_Var4 = borg_item_note_needs_id
                                           ((borg_item_conflict *)(pbVar3->desc + lVar14)), !_Var4))
                 && ((((player->opts).opt[0x1e] != true || (pbVar3->curses[lVar14 + -0x22] == false)
                      ) || (pbVar3->curses[lVar14 + -0x2e] == true)))))) {
            borg_items->curses[lVar14 + -0x26] = (_Bool)(borg_items->curses[lVar14 + -0x26] + -1);
            borg_notice(true);
            iVar8 = borg_power();
            memcpy(borg_items->desc + lVar14,safe_items->desc + lVar14,0x388);
            if (local_44 < iVar8) {
              local_48 = (int)uVar16;
              local_44 = iVar8;
            }
            bVar5 = true;
          }
        }
LAB_0022fa67:
        pbVar3 = borg_items;
        uVar16 = uVar16 + 1;
        lVar14 = lVar14 + 0x388;
      } while (uVar16 < z_info->pack_size);
      if (local_48 != -1) {
        lVar14 = (long)local_48;
        pcVar9 = format("# Dropping junk %s (valued at %ld)",borg_items + lVar14,(long)local_4c);
        borg_note(pcVar9);
        borg_keypress(0x7b);
        cVar2 = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar14];
        borg_keypress((int)cVar2);
        borg_keypresses("borg ignore");
        borg_keypress(0x9c);
        borg_keypress(100);
        borg_keypress((int)cVar2);
        if (pbVar3[lVar14].iqty < 2) {
          return true;
        }
        borg_keypress(0x31);
        borg_keypress(0x9c);
        return true;
      }
      if (bVar5) {
        borg_notice(true);
      }
    }
    borg_do_crush_junk = false;
  }
  return false;
}

Assistant:

bool borg_drop_junk(void)
{
    int     i, b_i = -1;
    bool    fix = false;
    int32_t p, b_p = borg.power;
    int32_t value;

    /* Hack -- no need */
    if (!borg_do_crush_junk)
        return false;

    /* not while recalling since this is a two step process */
    /* and if the recall kicks in in the middle it confuses things */
    if (borg.goal.recalling)
        return false;

    /* No crush if even slightly dangerous */
    if (borg_danger(borg.c.y, borg.c.x, 1, true, false)
        > borg.trait[BI_CURHP] / 10)
        return false;

    /* Destroy actual "junk" items */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* dont crush the swap */
        if (weapon_swap && i == weapon_swap - 1)
            continue;
        if (armour_swap && i == armour_swap - 1)
            continue;

        /* Dont crush weapons if we are weilding a digger */
#if 0
        if (item->tval >= TV_DIGGING && item->tval <= TV_SWORD &&
            borg_items[INVEN_WIELD].tval == TV_DIGGING) continue;
#endif

        /* dont crush our spell books */
        if (obj_kind_can_browse(&k_info[item->kind]))
            continue;

        /* Do not crush unID'd Scrolls, sell them in town */
        if (item->tval == TV_SCROLL && !item->aware)
            continue;

        /* Do not crush Boots, they could be SPEED */
        if (item->tval == TV_BOOTS && !item->ident)
            continue;

        /* save the items value */
        value = item->value;

        /* Crush Stacked Wands and Staves that are empty.
         * ie. 5 Staffs of Teleportation (2 charges).
         * Only 2 charges in 5 staves means top 3 are empty.
         */
        if ((item->tval == TV_STAFF || item->tval == TV_WAND)
            && (item->aware || (item->note && strstr(item->note, "empty")))) {
            if (item->iqty > item->pval)
                value = 0L;
        }

        /* Skip non "worthless" items */
        if (item->tval >= TV_CHEST) {
            /* unknown and not worthless */
            if (!item->ident && value > 0)
                continue;

            /* skip items that are 'valuable'.  This is level dependent */
            /* try to make the borg junk +1,+1 dagger at level 40 */

            /* if the item gives a bonus to a stat, boost its value */
            if ((item->modifiers[OBJ_MOD_STR] > 0
                || item->modifiers[OBJ_MOD_INT] > 0
                || item->modifiers[OBJ_MOD_WIS] > 0
                || item->modifiers[OBJ_MOD_DEX] > 0
                || item->modifiers[OBJ_MOD_CON] > 0)
                && value > 0) {
                value += 2000L;
            }

            /* Keep some stuff */
            if (item->tval == borg.trait[BI_AMMO_TVAL] && value > 0)
            {
                value += 5000L;
            }

            if (item->aware && (((item->tval == TV_POTION
                    && item->sval == sv_potion_restore_mana)
                    && (borg.trait[BI_MAXSP] >= 1))
                || (item->tval == TV_POTION && item->sval == sv_potion_healing)
                || (item->tval == TV_POTION
                    && item->sval == sv_potion_star_healing)
                || (item->tval == TV_POTION && item->sval == sv_potion_life)
                || (item->tval == TV_POTION && item->sval == sv_potion_speed)
                || (item->tval == TV_ROD && item->sval == sv_rod_drain_life)
                || (item->tval == TV_ROD && item->sval == sv_rod_healing)
                || (item->tval == TV_ROD && item->sval == sv_rod_mapping
                    && borg.trait[BI_CLASS] == CLASS_WARRIOR)
                || (item->tval == TV_STAFF
                    && item->sval == sv_staff_dispel_evil)
                || (item->tval == TV_STAFF && item->sval == sv_staff_power)
                || (item->tval == TV_STAFF && item->sval == sv_staff_holiness)
                || (item->tval == TV_WAND && item->sval == sv_wand_drain_life)
                || (item->tval == TV_WAND && item->sval == sv_wand_annihilation)
                || (item->tval == TV_WAND && item->sval == sv_wand_teleport_away
                    && borg.trait[BI_CLASS] == CLASS_WARRIOR)
                || (item->ego_idx
                    && borg_ego_has_random_power(&e_info[item->ego_idx]))
                || (item->tval == TV_SCROLL
                    && item->sval == sv_scroll_teleport_level
                    && borg.trait[BI_ATELEPORTLVL] < 1000)
                || (item->tval == TV_SCROLL
                    && item->sval == sv_scroll_protection_from_evil)))

            {
                value += 5000L;
            }

            /* Go Ahead and crush diggers */
            if (item->tval == TV_DIGGING)
                value = 0L;

            /* Crush missiles that aren't mine */
            if (item->tval == TV_SHOT || item->tval == TV_ARROW
                || item->tval == TV_BOLT) {
                if (item->tval != borg.trait[BI_AMMO_TVAL])
                    value = 0L;
            }

            /* borg_worships_gold will sell all kinds of stuff,
             * except {cursed} is junk
             */
            if (item->value > 0
                && ((borg_cfg[BORG_WORSHIPS_GOLD]
                    || borg.trait[BI_MAXCLEVEL] < 10)
                    || ((borg_cfg[BORG_MONEY_SCUM_AMOUNT] < borg.trait[BI_GOLD])
                        && borg_cfg[BORG_MONEY_SCUM_AMOUNT] != 0))
                && borg.trait[BI_MAXCLEVEL] <= 20 && !item->cursed)
                continue;

            /* up to level 5, keep anything of any value */
            if (borg.trait[BI_CDEPTH] < 5 && value > 0)
                continue;
            /* up to level 10, keep anything of any value */
            if (borg.trait[BI_CDEPTH] < 10 && value > 15)
                continue;
            /* up to level 15, keep anything of value 100 or better */
            if (borg.trait[BI_CDEPTH] < 15 && value > 100)
                continue;
            /* up to level 30, keep anything of value 500 or better */
            if (borg.trait[BI_CDEPTH] < 30 && value > 500)
                continue;
            /* up to level 40, keep anything of value 1000 or better */
            if (borg.trait[BI_CDEPTH] < 40 && value > 1000)
                continue;
            /* up to level 60, keep anything of value 1200 or better */
            if (borg.trait[BI_CDEPTH] < 60 && value > 1200)
                continue;
            /* up to level 80, keep anything of value 1400 or better */
            if (borg.trait[BI_CDEPTH] < 80 && value > 1400)
                continue;
            /* up to level 90, keep anything of value 1600 or better */
            if (borg.trait[BI_CDEPTH] < 90 && value > 1600)
                continue;
            /* up to level 95, keep anything of value 4800 or better */
            if (borg.trait[BI_CDEPTH] < 95 && value > 4800)
                continue;
            /* below level 127, keep anything of value 2000 or better */
            if (borg.trait[BI_CDEPTH] < 127 && value > 5600)
                continue;

            /* Hack -- skip good un-id'd "artifacts" */
            if (borg_item_note_needs_id(item))
                continue;

            /* hack --  with random artifacts some are good and bad */
            /*         so check them all */
            if (OPT(player, birth_randarts) && item->art_idx && !item->ident)
                continue;

            /* Destroy one item */
            borg_items[i].iqty -= 1;

            /* Fix later */
            fix = true;

            /* Examine the inventory */
            borg_notice(true);

            /* Evaluate the inventory */
            p = borg_power();

            /* Restore the item */
            memcpy(&borg_items[i], &safe_items[i], sizeof(borg_item));

            /* skip things we are using */
            if (p > b_p) {
                b_p = p;
                b_i = i;
            }

        }
    }

    /* if we found something junky, junk it */
    if ( b_i != -1) {
        borg_item *item = &borg_items[b_i];

        /* Message */
        borg_note(format("# Dropping junk %s (valued at %ld)", item->desc, (long int)value));

        /* inscribe "borg ignore". The borg crushes all items */
        /* on the floor that are inscribed this way */
        borg_keypress('{');
        borg_keypress(all_letters_nohjkl[b_i]);
        borg_keypresses("borg ignore");
        borg_keypress(KC_ENTER);

        /* drop it then ignore it */
        borg_keypress('d');
        borg_keypress(all_letters_nohjkl[b_i]);

        if (item->iqty > 1) {
            borg_keypress('1');
            borg_keypress(KC_ENTER);
        }

        /* Success */
        return true;
    }

    /* re-examine the inventory */
    if (fix)
        borg_notice(true);

    /* Hack -- no need */
    borg_do_crush_junk = false;

    /* Nothing to destroy */
    return false;
}